

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cpp
# Opt level: O2

PointCloudColorQuantity * __thiscall
polyscope::PointCloud::addColorQuantityImpl
          (PointCloud *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *colors)

{
  PointCloudColorQuantity *this_00;
  string local_40;
  
  this_00 = (PointCloudColorQuantity *)operator_new(0x88);
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  PointCloudColorQuantity::PointCloudColorQuantity(this_00,&local_40,colors,this);
  std::__cxx11::string::~string((string *)&local_40);
  QuantityStructure<polyscope::PointCloud>::addQuantity
            (&this->super_QuantityStructure<polyscope::PointCloud>,(QuantityType *)this_00,true);
  return this_00;
}

Assistant:

PointCloudColorQuantity* PointCloud::addColorQuantityImpl(std::string name, const std::vector<glm::vec3>& colors) {
  PointCloudColorQuantity* q = new PointCloudColorQuantity(name, colors, *this);
  addQuantity(q);
  return q;
}